

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

bool __thiscall
flatbuffers::SymbolTable<flatbuffers::EnumDef>::Add
          (SymbolTable<flatbuffers::EnumDef> *this,string *name,EnumDef *e)

{
  iterator iVar1;
  bool bVar2;
  mapped_type *ppEVar3;
  _Self local_38;
  _Self local_30;
  iterator it;
  EnumDef *e_local;
  string *name_local;
  SymbolTable<flatbuffers::EnumDef> *this_local;
  
  it._M_node = (_Base_ptr)e;
  std::vector<flatbuffers::EnumDef*,std::allocator<flatbuffers::EnumDef*>>::
  emplace_back<flatbuffers::EnumDef*&>
            ((vector<flatbuffers::EnumDef*,std::allocator<flatbuffers::EnumDef*>> *)&this->vec,
             (EnumDef **)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
       ::find(&this->dict,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
       ::end(&this->dict);
  bVar2 = std::operator!=(&local_30,&local_38);
  iVar1 = it;
  if (!bVar2) {
    ppEVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
              ::operator[](&this->dict,name);
    *ppEVar3 = (mapped_type)iVar1._M_node;
  }
  return bVar2;
}

Assistant:

bool Add(const std::string &name, T *e) {
    vec.emplace_back(e);
    auto it = dict.find(name);
    if (it != dict.end()) return true;
    dict[name] = e;
    return false;
  }